

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryData.cpp
# Opt level: O3

void __thiscall amrex::BndryData::BndryData(BndryData *this,BndryData *src)

{
  BndryRegister::BndryRegister(&this->super_BndryRegister,&src->super_BndryRegister);
  (this->super_BndryRegister)._vptr_BndryRegister = (_func_int **)&PTR__BndryData_0080fc20;
  FabArrayBase::FabArrayBase(&(this->bcond).super_FabArrayBase);
  (this->bcond).super_FabArrayBase._vptr_FabArrayBase = (_func_int **)&PTR__LayoutData_0080fc58;
  (this->bcond).m_data.
  super_vector<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>_>
  .
  super__Vector_base<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bcond).m_data.
  super_vector<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>_>
  .
  super__Vector_base<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->bcond).m_data.
           super_vector<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->bcond).m_data.
           super_vector<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  FabArrayBase::FabArrayBase(&(this->bcloc).super_FabArrayBase);
  (this->bcloc).super_FabArrayBase._vptr_FabArrayBase = (_func_int **)&PTR__LayoutData_0080fc90;
  (this->bcloc).m_data.
  super_vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>.
  super__Vector_base<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bcloc).m_data.
  super_vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>.
  super__Vector_base<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->bcloc).m_data.
           super_vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>.
           super__Vector_base<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->bcloc).m_data.
           super_vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>.
           super__Vector_base<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->masks).super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>.
  super__Vector_base<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->masks).super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>.
  super__Vector_base<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->masks).super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>.
  super__Vector_base<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Geometry::Geometry(&this->geom);
  this->m_ncomp = src->m_ncomp;
  init(this,(EVP_PKEY_CTX *)src);
  return;
}

Assistant:

BndryData::BndryData (const BndryData& src)
    :
    BndryRegister(src),
    m_ncomp(src.m_ncomp)
{
    init(src);
}